

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

Abc_Obj_t * Ver_ParseFindNet(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pName_00;
  
  pAVar2 = Abc_NtkFindNet(pNtk,pName);
  if (pAVar2 != (Abc_Obj_t *)0x0) {
    return pAVar2;
  }
  pName_00 = "1\'b0";
  iVar1 = strcmp(pName,"1\'b0");
  if ((iVar1 != 0) && (iVar1 = strcmp(pName,"1\'bx"), iVar1 != 0)) {
    pName_00 = "1\'b1";
    iVar1 = strcmp(pName,"1\'b1");
    if (iVar1 != 0) {
      return (Abc_Obj_t *)0x0;
    }
  }
  pAVar2 = Abc_NtkFindOrCreateNet(pNtk,pName_00);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Ver_ParseFindNet( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pObj;
    if ( (pObj = Abc_NtkFindNet(pNtk, pName)) )
        return pObj;
    if ( !strcmp( pName, "1\'b0" ) || !strcmp( pName, "1\'bx" ) )
        return Abc_NtkFindOrCreateNet( pNtk, "1\'b0" );
    if ( !strcmp( pName, "1\'b1" ) )
        return Abc_NtkFindOrCreateNet( pNtk, "1\'b1" );
    return NULL;
}